

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_rowcol
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  parasail_result_t *ppVar6;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong size;
  uint uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  uint local_84;
  int local_80;
  int local_78;
  uint local_38;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_rowcol_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sg_flags_rowcol_cold_6();
  }
  else if (open < 0) {
    parasail_sg_flags_rowcol_cold_5();
  }
  else if (gap < 0) {
    parasail_sg_flags_rowcol_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_rowcol_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sg_flags_rowcol_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sg_flags_rowcol_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    ppVar6 = parasail_result_new_rowcol1(_s1Len,s2Len);
    if (ppVar6 != (parasail_result_t *)0x0) {
      ppVar6->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                     (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar6->flag |
                     0x1440102;
      ptr = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
      size = (ulong)(s2Len + 1);
      ptr_00 = parasail_memalign_int(0x10,size);
      ptr_01 = parasail_memalign_int(0x10,size);
      if (ptr_01 != (int *)0x0 && (ptr_00 != (int *)0x0 && ptr != (int *)0x0)) {
        if (matrix->type == 0) {
          ptr_02 = parasail_memalign_int(0x10,(long)_s1Len);
          if (ptr_02 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar2 = matrix->mapper;
            uVar8 = 0;
            do {
              ptr_02[uVar8] = piVar2[(byte)_s1[uVar8]];
              uVar8 = uVar8 + 1;
            } while ((uint)_s1Len != uVar8);
          }
        }
        else {
          ptr_02 = (int *)0x0;
        }
        piVar2 = matrix->mapper;
        uVar8 = 0;
        do {
          ptr[uVar8] = piVar2[(byte)_s2[uVar8]];
          uVar8 = uVar8 + 1;
        } while ((uint)s2Len != uVar8);
        *ptr_00 = 0;
        *ptr_01 = -0x40000000;
        if (s2_beg == 0) {
          iVar4 = -open;
          uVar8 = 1;
          do {
            ptr_00[uVar8] = iVar4;
            ptr_01[uVar8] = -0x40000000;
            uVar8 = uVar8 + 1;
            iVar4 = iVar4 - gap;
          } while (size != uVar8);
        }
        else {
          uVar8 = 1;
          do {
            ptr_00[uVar8] = 0;
            ptr_01[uVar8] = -0x40000000;
            uVar8 = uVar8 + 1;
          } while (size != uVar8);
        }
        local_78 = s2Len;
        local_84 = _s1Len;
        if (_s1Len < 2) {
          local_80 = -0x40000000;
          uVar12 = 1;
        }
        else {
          piVar2 = matrix->matrix;
          local_80 = -0x40000000;
          uVar8 = 1;
          do {
            iVar4 = matrix->size;
            lVar3 = uVar8 - 1;
            if (matrix->type == 0) {
              lVar3 = (long)ptr_02[uVar8 - 1];
            }
            iVar15 = (1 - (int)uVar8) * gap - open;
            if (s1_beg != 0) {
              iVar15 = 0;
            }
            iVar10 = *ptr_00;
            *ptr_00 = iVar15;
            iVar9 = -0x40000000;
            lVar13 = 0;
            do {
              iVar11 = ptr_00[lVar13 + 1];
              iVar7 = iVar11 - open;
              iVar14 = ptr_01[lVar13 + 1] - gap;
              if (ptr_01[lVar13 + 1] - gap < iVar7) {
                iVar14 = iVar7;
              }
              ptr_01[lVar13 + 1] = iVar14;
              iVar7 = iVar9 - gap;
              iVar9 = iVar15 - open;
              if (iVar15 - open <= iVar7) {
                iVar9 = iVar7;
              }
              iVar15 = iVar10 + piVar2[iVar4 * lVar3 + (long)ptr[lVar13]];
              if (iVar15 <= iVar9) {
                iVar15 = iVar9;
              }
              if (iVar15 <= iVar14) {
                iVar15 = iVar14;
              }
              ptr_00[lVar13 + 1] = iVar15;
              lVar13 = lVar13 + 1;
              iVar10 = iVar11;
            } while (size - 1 != lVar13);
            ((ppVar6->field_4).rowcols)->score_col[uVar8 - 1] = iVar15;
            if (s1_end != 0 && local_80 < iVar15) {
              local_78 = s2Len + -1;
            }
            local_38 = (uint)(uVar8 - 1);
            if (s1_end != 0 && local_80 < iVar15) {
              local_80 = iVar15;
              local_84 = local_38;
            }
            uVar8 = uVar8 + 1;
            uVar12 = _s1Len;
          } while (uVar8 != (uint)_s1Len);
        }
        iVar4 = uVar12 - 1;
        piVar2 = matrix->matrix;
        iVar15 = matrix->size;
        if (matrix->type == 0) {
          iVar4 = ptr_02[iVar4];
        }
        iVar10 = *ptr_00;
        iVar9 = 0;
        if (s1_beg == 0) {
          iVar9 = (1 - uVar12) * gap - open;
        }
        *ptr_00 = iVar9;
        uVar1 = _s1Len - 1;
        iVar11 = -0x40000000;
        uVar8 = 1;
        do {
          iVar14 = ptr_00[uVar8];
          iVar5 = iVar14 - open;
          iVar7 = ptr_01[uVar8] - gap;
          if (ptr_01[uVar8] - gap < iVar5) {
            iVar7 = iVar5;
          }
          ptr_01[uVar8] = iVar7;
          iVar5 = iVar11 - gap;
          iVar11 = iVar9 - open;
          if (iVar9 - open <= iVar5) {
            iVar11 = iVar5;
          }
          iVar9 = iVar10 + piVar2[(long)(iVar15 * iVar4) + (long)ptr[uVar8 - 1]];
          if (iVar9 <= iVar11) {
            iVar9 = iVar11;
          }
          if (iVar9 <= iVar7) {
            iVar9 = iVar7;
          }
          ptr_00[uVar8] = iVar9;
          iVar10 = (int)uVar8 + -1;
          if (s1_end == 0 || s2_end == 0) {
            if ((s2_end != 0) && (local_80 < iVar9)) goto LAB_0055a098;
          }
          else if (local_80 < iVar9) {
LAB_0055a098:
            local_84 = uVar1;
            local_78 = iVar10;
            local_80 = iVar9;
          }
          else if ((long)uVar8 <= (long)local_78 && iVar9 == local_80) {
            local_84 = uVar1;
            local_78 = iVar10;
          }
          ((ppVar6->field_4).rowcols)->score_row[uVar8 - 1] = iVar9;
          uVar8 = uVar8 + 1;
          iVar10 = iVar14;
          if (size == uVar8) {
            if (s2_end == 0 && s1_end == 0 || local_80 < iVar9 && s1_end != 0) {
              local_80 = iVar9;
              local_84 = uVar1;
              local_78 = s2Len + -1;
            }
            ((ppVar6->field_4).rowcols)->score_col[(ulong)uVar12 - 1] = iVar9;
            ppVar6->score = local_80;
            ppVar6->end_query = local_84;
            ppVar6->end_ref = local_78;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(ptr_02);
              return ppVar6;
            }
            return ppVar6;
          }
        } while( true );
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    if (s2_beg) {
        for (j=1; j<=s2Len; ++j) {
            H[j] = 0;
            F[j] = NEG_INF_32;
        }
    }
    else {
        for (j=1; j<=s2Len; ++j) {
            H[j] = -open -(j-1)*gap;
            F[j] = NEG_INF_32;
        }
    }

    /* iter over first sequence */
    for (i=1; i<s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = s1_beg ? 0 : (-open - (i-1)*gap);
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
#ifdef PARASAIL_TABLE
            result->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
#endif
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_col[i-1] = WH;
#endif
        if (s1_end && WH > score) {
            score = WH;
            end_query = i-1;
            end_ref = s2Len-1;
        }
    }
    {
        /* i == s1Len */
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = s1_beg ? 0 : -open - (i-1)*gap;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
            if (s1_end && s2_end) {
                if (WH > score) {
                    score = WH;
                    end_query = s1Len-1;
                    end_ref = j-1;
                }
                else if (WH == score && j-1 < end_ref) {
                    end_query = s1Len-1;
                    end_ref = j-1;
                }
            }
            else if (s2_end) {
                if (WH > score) {
                    score = WH;
                    end_query = s1Len-1;
                    end_ref = j-1;
                }
            }
#ifdef PARASAIL_TABLE
            result->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
#endif
#ifdef PARASAIL_ROWCOL
            result->rowcols->score_row[j-1] = H[j];
#endif
        }
        if ((s1_end && WH > score) || (!s1_end && !s2_end)) {
            score = WH;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_col[i-1] = WH;
#endif
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}